

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gethostname.c
# Opt level: O0

int run_test_gethostname(void)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  ulong uStack_68;
  int r;
  size_t enobufs_size;
  size_t size;
  char buf [65];
  
  enobufs_size = 1;
  iVar2 = uv_os_gethostname(0,&enobufs_size);
  if (iVar2 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x23,"r == UV_EINVAL");
    abort();
  }
  iVar2 = uv_os_gethostname(&size,0);
  if (iVar2 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x25,"r == UV_EINVAL");
    abort();
  }
  enobufs_size = 0;
  iVar2 = uv_os_gethostname(&size,&enobufs_size);
  if (iVar2 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x28,"r == UV_EINVAL");
    abort();
  }
  uStack_68 = 1;
  size._0_1_ = '\0';
  iVar2 = uv_os_gethostname(&size,&stack0xffffffffffffff98);
  if (iVar2 != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x2e,"r == UV_ENOBUFS");
    abort();
  }
  if ((char)size != '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x2f,"buf[0] == \'\\0\'");
    abort();
  }
  if (uStack_68 < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x30,"enobufs_size > 1");
    abort();
  }
  enobufs_size = 0x41;
  iVar2 = uv_os_gethostname(&size,&enobufs_size);
  sVar1 = enobufs_size;
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
            ,0x35,"r == 0");
    abort();
  }
  if (1 < enobufs_size) {
    sVar3 = strlen((char *)&size);
    if (sVar1 == sVar3) {
      if (enobufs_size + 1 != uStack_68) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
                ,0x37,"size + 1 == enobufs_size");
        abort();
      }
      return 0;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
          ,0x36,"size > 1 && size == strlen(buf)");
  abort();
}

Assistant:

TEST_IMPL(gethostname) {
  char buf[UV_MAXHOSTNAMESIZE];
  size_t size;
  size_t enobufs_size;
  int r;

  /* Reject invalid inputs */
  size = 1;
  r = uv_os_gethostname(NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_gethostname(buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_gethostname(buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Return UV_ENOBUFS if the buffer cannot hold the hostname */
  enobufs_size = 1;
  buf[0] = '\0';
  r = uv_os_gethostname(buf, &enobufs_size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(buf[0] == '\0');
  ASSERT(enobufs_size > 1);

  /* Successfully get the hostname */
  size = UV_MAXHOSTNAMESIZE;
  r = uv_os_gethostname(buf, &size);
  ASSERT(r == 0);
  ASSERT(size > 1 && size == strlen(buf));
  ASSERT(size + 1 == enobufs_size);

  return 0;
}